

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# io.c
# Opt level: O0

Literal getInt(int line)

{
  Literal LVar1;
  int iVar2;
  undefined8 local_30;
  long l;
  char *s;
  int line_local;
  Literal lit;
  
  s._4_4_ = line;
  l = (long)readString();
  while( true ) {
    iVar2 = isInt((char *)l);
    if (iVar2 != 0) break;
    printf("\x1b[33m\n[Warning] [Input Error] Not an integer : %s!\n[Re-Input] \x1b[0m",l);
    l = (long)readString();
  }
  local_30 = 0;
  __isoc99_sscanf(l,"%ld",&local_30);
  free((void *)l);
  lit.line = (int)local_30;
  lit.type = (LiteralType)((ulong)local_30 >> 0x20);
  LVar1.type = 1;
  LVar1.line = s._4_4_;
  LVar1.field_2.lVal = lit.line;
  LVar1.field_2.iVal._4_4_ = lit.type;
  return LVar1;
}

Assistant:

Literal getInt(int line){
    char *s = readString();
    while(!isInt(s)){
        printf(warning("[Input Error] Not an integer : %s!\n[Re-Input] "), s);
        s = readString();
    }
    long l = 0;
    sscanf(s, "%ld", &l);
    memfree(s);
    Literal lit = {line, LIT_INT, {0}};
    lit.iVal = l;
    return lit;
}